

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::AdvancedAllMipsFS::Setup(AdvancedAllMipsFS *this)

{
  GLuint GVar1;
  CallLogWrapper *this_00;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *glsl_load_cs;
  char *glsl_store_fs;
  char *glsl_vs;
  AdvancedAllMipsFS *this_local;
  
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glsl_vs = (char *)this;
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->m_texture);
  ShaderImageLoadStoreBase::CreateFullViewportQuad
            (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,&this->m_ebo);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_buffer);
  glsl_store_fs =
       "\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}";
  glsl_load_cs = 
  "\nlayout(rgba32f, binding = 0) writeonly uniform image2D g_image[4];\nvoid main() {\n  imageStore(g_image[0], ivec2(gl_FragCoord), vec4(23));\n  imageStore(g_image[1], ivec2(gl_FragCoord), vec4(24));\n  imageStore(g_image[2], ivec2(gl_FragCoord), vec4(25));\n  imageStore(g_image[3], ivec2(gl_FragCoord), vec4(26));\n  discard;\n}"
  ;
  local_28 = 
  "\n#define KSIZE 11\nlayout (local_size_x = KSIZE, local_size_y = KSIZE) in;\nlayout(rgba32f, binding = 0) readonly uniform image2D g_image[4];\nlayout(std430) buffer out_data {\n  ivec4 data[KSIZE*KSIZE];\n};\nvoid main() {\n  ivec2 coord = ivec2(gl_LocalInvocationID);\n  data[gl_LocalInvocationIndex] = ivec4(2, 3, 4, 5);\n  vec4 c0 = imageLoad(g_image[0], coord);\n  vec4 c1 = imageLoad(g_image[1], coord);\n  vec4 c2 = imageLoad(g_image[2], coord);\n  vec4 c3 = imageLoad(g_image[3], coord);\n  if ((all(lessThan(coord, ivec2(2))) && c0 != vec4(23)) || (any(greaterThanEqual(coord, ivec2(2))) && c0.xyz != vec3(0.0)))\n      data[gl_LocalInvocationIndex][0] = int(c0.x);\n  if ((all(lessThan(coord, ivec2(4))) && c1 != vec4(24)) || (any(greaterThanEqual(coord, ivec2(4))) && c1.xyz != vec3(0.0)))\n      data[gl_LocalInvocationIndex][1] = int(c1.x);\n  if ((all(lessThan(coord, ivec2(8))) && c2 != vec4(25)) || (any(greaterThanEqual(coord, ivec2(8))) && c2.xyz != vec3(0.0)))\n      data[gl_LocalInvocationIndex][2] = int(c2.x);\n  if ((all(lessThan(coord, ivec2(16))) && c3 != vec4(26)) || (any(greaterThanEqual(coord, ivec2(16))) && c3.xyz != vec3(0.0)))\n      data[gl_LocalInvocationIndex][3] = int(c3.x);\n}"
  ;
  GVar1 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,
                     "\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,
                     "\nlayout(rgba32f, binding = 0) writeonly uniform image2D g_image[4];\nvoid main() {\n  imageStore(g_image[0], ivec2(gl_FragCoord), vec4(23));\n  imageStore(g_image[1], ivec2(gl_FragCoord), vec4(24));\n  imageStore(g_image[2], ivec2(gl_FragCoord), vec4(25));\n  imageStore(g_image[3], ivec2(gl_FragCoord), vec4(26));\n  discard;\n}"
                     ,false,false);
  this->m_store_program = GVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "\n#define KSIZE 11\nlayout (local_size_x = KSIZE, local_size_y = KSIZE) in;\nlayout(rgba32f, binding = 0) readonly uniform image2D g_image[4];\nlayout(std430) buffer out_data {\n  ivec4 data[KSIZE*KSIZE];\n};\nvoid main() {\n  ivec2 coord = ivec2(gl_LocalInvocationID);\n  data[gl_LocalInvocationIndex] = ivec4(2, 3, 4, 5);\n  vec4 c0 = imageLoad(g_image[0], coord);\n  vec4 c1 = imageLoad(g_image[1], coord);\n  vec4 c2 = imageLoad(g_image[2], coord);\n  vec4 c3 = imageLoad(g_image[3], coord);\n  if ((all(lessThan(coord, ivec2(2))) && c0 != vec4(23)) || (any(greaterThanEqual(coord, ivec2(2))) && c0.xyz != vec3(0.0)))\n      data[gl_LocalInvocationIndex][0] = int(c0.x);\n  if ((all(lessThan(coord, ivec2(4))) && c1 != vec4(24)) || (any(greaterThanEqual(coord, ivec2(4))) && c1.xyz != vec3(0.0)))\n      data[gl_LocalInvocationIndex][1] = int(c1.x);\n  if ((all(lessThan(coord, ivec2(8))) && c2 != vec4(25)) || (any(greaterThanEqual(coord, ivec2(8))) && c2.xyz != vec3(0.0)))\n      data[gl_LocalInvocationIndex][2] = int(c2.x);\n  if ((all(lessThan(coord, ivec2(16))) && c3 != vec4(26)) || (any(greaterThanEqual(coord, ivec2(16))) && c3.xyz != vec3(0.0)))\n      data[gl_LocalInvocationIndex][3] = int(c3.x);\n}"
             ,&local_49);
  GVar1 = ShaderImageLoadStoreBase::CreateComputeProgram
                    (&this->super_ShaderImageLoadStoreBase,&local_48,false);
  this->m_load_program = GVar1;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return 0;
}

Assistant:

virtual long Setup()
	{
		glGenTextures(1, &m_texture);
		CreateFullViewportQuad(&m_vao, &m_vbo, &m_ebo);
		glGenBuffers(1, &m_buffer);

		const char* const glsl_vs =
			NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL "  gl_Position = i_position;" NL "}";
		const char* const glsl_store_fs =
			NL "layout(rgba32f, binding = 0) writeonly uniform image2D g_image[4];" NL "void main() {" NL
			   "  imageStore(g_image[0], ivec2(gl_FragCoord), vec4(23));" NL
			   "  imageStore(g_image[1], ivec2(gl_FragCoord), vec4(24));" NL
			   "  imageStore(g_image[2], ivec2(gl_FragCoord), vec4(25));" NL
			   "  imageStore(g_image[3], ivec2(gl_FragCoord), vec4(26));" NL "  discard;" NL "}";
		const char* const glsl_load_cs = NL
			"#define KSIZE 11" NL "layout (local_size_x = KSIZE, local_size_y = KSIZE) in;" NL
			"layout(rgba32f, binding = 0) readonly uniform image2D g_image[4];" NL "layout(std430) buffer out_data {" NL
			"  ivec4 data[KSIZE*KSIZE];" NL "};" NL "void main() {" NL "  ivec2 coord = ivec2(gl_LocalInvocationID);" NL
			"  data[gl_LocalInvocationIndex] = ivec4(2, 3, 4, 5);" NL "  vec4 c0 = imageLoad(g_image[0], coord);" NL
			"  vec4 c1 = imageLoad(g_image[1], coord);" NL "  vec4 c2 = imageLoad(g_image[2], coord);" NL
			"  vec4 c3 = imageLoad(g_image[3], coord);" NL
			"  if ((all(lessThan(coord, ivec2(2))) && c0 != vec4(23)) || (any(greaterThanEqual(coord, ivec2(2))) && "
			"c0.xyz != vec3(0.0)))" NL "      data[gl_LocalInvocationIndex][0] = int(c0.x);" NL
			"  if ((all(lessThan(coord, ivec2(4))) && c1 != vec4(24)) || (any(greaterThanEqual(coord, ivec2(4))) && "
			"c1.xyz != vec3(0.0)))" NL "      data[gl_LocalInvocationIndex][1] = int(c1.x);" NL
			"  if ((all(lessThan(coord, ivec2(8))) && c2 != vec4(25)) || (any(greaterThanEqual(coord, ivec2(8))) && "
			"c2.xyz != vec3(0.0)))" NL "      data[gl_LocalInvocationIndex][2] = int(c2.x);" NL
			"  if ((all(lessThan(coord, ivec2(16))) && c3 != vec4(26)) || (any(greaterThanEqual(coord, ivec2(16))) && "
			"c3.xyz != vec3(0.0)))" NL "      data[gl_LocalInvocationIndex][3] = int(c3.x);" NL "}";
		m_store_program = BuildProgram(glsl_vs, glsl_store_fs);
		m_load_program  = CreateComputeProgram(glsl_load_cs);

		return NO_ERROR;
	}